

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBMultiFabUtil.cpp
# Opt level: O3

void amrex::EB_average_down
               (MultiFab *S_fine,MultiFab *S_crse,MultiFab *vol_fine,MultiFab *vfrac_fine,int scomp,
               int ncomp,IntVect *ratio)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  FArrayBox *pFVar10;
  FArrayBox *fab;
  double *pdVar11;
  double *pdVar12;
  FabType FVar13;
  int *piVar14;
  EBCellFlagFab *this;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  Periodicity *period;
  long lVar20;
  long lVar21;
  long lVar22;
  int iVar23;
  int iVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  int iref;
  int iVar29;
  ulong uVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  ulong uVar34;
  long lVar35;
  ulong uVar36;
  long lVar37;
  long lVar38;
  uint uVar39;
  int iVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  long lVar47;
  long lVar48;
  long lVar49;
  long lVar50;
  int iVar51;
  long lVar52;
  long lVar53;
  long lVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  long local_510;
  long local_500;
  ulong local_4f0;
  long local_4e8;
  long local_4e0;
  long local_490;
  Box local_484;
  Box result;
  int local_448;
  int local_444;
  int local_440;
  MFIter mfi;
  Array4<const_double> local_258;
  BoxArray crse_S_fine_BA;
  MultiFab crse_S_fine;
  
  BoxArray::BoxArray(&crse_S_fine_BA,
                     &(S_fine->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray);
  BoxArray::coarsen(&crse_S_fine_BA,ratio);
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
       (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>)
       (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
  mfi.fabArray = (FabArrayBase *)0x0;
  mfi.tile_size.vect[0] = 0;
  mfi.tile_size.vect[1] = 0;
  mfi.tile_size.vect[2] = 0;
  mfi.flags = '\0';
  mfi._29_3_ = 0;
  mfi.currentIndex = 0;
  mfi.beginIndex = 0;
  result.smallend.vect._0_8_ = &PTR__FabFactory_00712918;
  MultiFab::MultiFab(&crse_S_fine,&crse_S_fine_BA,
                     &(S_fine->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap,
                     ncomp,0,(MFInfo *)&mfi,(FabFactory<amrex::FArrayBox> *)&result);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&mfi.tile_size);
  iVar2 = ratio->vect[0];
  iVar3 = ratio->vect[1];
  iVar4 = ratio->vect[2];
  MFIter::MFIter(&mfi,(FabArrayBase *)&crse_S_fine,true);
  if (mfi.currentIndex < mfi.endIndex) {
    lVar1 = (long)scomp * 8;
    do {
      MFIter::tilebox(&local_484,&mfi);
      piVar14 = &mfi.currentIndex;
      if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar14 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start + mfi.currentIndex;
      }
      pFVar10 = crse_S_fine.super_FabArray<amrex::FArrayBox>.m_fabs_v.
                super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>._M_impl.
                super__Vector_impl_data._M_start[*piVar14];
      fab = (S_fine->super_FabArray<amrex::FArrayBox>).m_fabs_v.
            super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>._M_impl.
            super__Vector_impl_data._M_start[*piVar14];
      this = getEBCellFlagFab(fab);
      result.smallend.vect[1] = local_484.smallend.vect[1];
      result.smallend.vect[0] = local_484.smallend.vect[0];
      result.bigend.vect[1] = local_484.bigend.vect[1];
      result.bigend.vect[2] = local_484.bigend.vect[2];
      result.smallend.vect[2] = local_484.smallend.vect[2];
      result.bigend.vect[0] = local_484.bigend.vect[0];
      iVar5 = ratio->vect[0];
      iVar6 = ratio->vect[1];
      iVar7 = ratio->vect[2];
      if (iVar7 != 1 || (iVar6 != 1 || iVar5 != 1)) {
        uVar8 = (uint)((local_484.btype.itype & 2) == 0);
        result.smallend.vect[1] = local_484.smallend.vect[1] * iVar6;
        result.smallend.vect[0] = local_484.smallend.vect[0] * iVar5;
        result.smallend.vect[2] = local_484.smallend.vect[2] * iVar7;
        uVar39 = (uint)((local_484.btype.itype & 4) == 0);
        result.bigend.vect[0] =
             (local_484.bigend.vect[0] + (~local_484.btype.itype & 1)) * iVar5 -
             (~local_484.btype.itype & 1);
        result.bigend.vect[1] = (local_484.bigend.vect[1] + uVar8) * iVar6 - uVar8;
        result.bigend.vect[2] = (local_484.bigend.vect[2] + uVar39) * iVar7 - uVar39;
      }
      FVar13 = EBCellFlagFab::getType(this,&result);
      pdVar11 = (pFVar10->super_BaseFab<double>).dptr;
      iVar5 = (pFVar10->super_BaseFab<double>).domain.smallend.vect[0];
      iVar6 = (pFVar10->super_BaseFab<double>).domain.smallend.vect[1];
      iVar7 = (pFVar10->super_BaseFab<double>).domain.smallend.vect[2];
      lVar15 = (long)(((pFVar10->super_BaseFab<double>).domain.bigend.vect[0] - iVar5) + 1);
      lVar20 = (((pFVar10->super_BaseFab<double>).domain.bigend.vect[1] - iVar6) + 1) * lVar15;
      lVar16 = (((pFVar10->super_BaseFab<double>).domain.bigend.vect[2] - iVar7) + 1) * lVar20;
      pdVar12 = (fab->super_BaseFab<double>).dptr;
      iVar29 = (fab->super_BaseFab<double>).domain.smallend.vect[0];
      lVar41 = (long)iVar29;
      iVar51 = (fab->super_BaseFab<double>).domain.smallend.vect[1];
      lVar31 = (long)iVar51;
      iVar24 = (fab->super_BaseFab<double>).domain.smallend.vect[2];
      lVar32 = (long)iVar24;
      lVar17 = (long)(((fab->super_BaseFab<double>).domain.bigend.vect[0] - iVar29) + 1);
      lVar18 = (long)(((fab->super_BaseFab<double>).domain.bigend.vect[1] - iVar51) + 1);
      lVar25 = (long)(((fab->super_BaseFab<double>).domain.bigend.vect[2] - iVar24) + 1);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                ((Array4<const_double> *)&result,&vol_fine->super_FabArray<amrex::FArrayBox>,&mfi);
      if ((uint)(FVar13 + singlevalued) < 2) {
        if (0 < ncomp) {
          lVar33 = (long)local_484.smallend.vect[1];
          local_500 = (long)pdVar12 + lVar17 * lVar25 * lVar1 * lVar18 + lVar41 * -8;
          lVar41 = lVar18 * 8 * lVar17;
          local_4f0 = 0;
          do {
            if (local_484.smallend.vect[2] <= local_484.bigend.vect[2]) {
              local_4e8 = (long)local_484.smallend.vect[2];
              do {
                if (local_484.smallend.vect[1] <= local_484.bigend.vect[1]) {
                  uVar8 = ratio->vect[0];
                  uVar39 = ratio->vect[1];
                  uVar9 = ratio->vect[2];
                  lVar26 = (long)(int)uVar39;
                  lVar52 = (long)local_484.smallend.vect[0] * 8 * (long)(int)uVar8;
                  local_490 = (((int)uVar9 * local_4e8 - lVar32) * lVar18 * 8 +
                              lVar33 * 8 * lVar26 + lVar31 * -8) * lVar17 + local_500 + lVar52;
                  lVar43 = (long)(int)uVar8 * 8;
                  local_510 = lVar33 * lVar26;
                  local_4e0 = lVar33;
                  do {
                    if (local_484.smallend.vect[0] <= local_484.bigend.vect[0]) {
                      lVar37 = (long)local_484.smallend.vect[0];
                      lVar49 = local_490;
                      lVar54 = lVar52;
                      do {
                        dVar55 = NAN;
                        if (0 < (int)uVar9) {
                          lVar44 = CONCAT44(result.bigend.vect[0],result.smallend.vect[2]) * 8;
                          lVar27 = CONCAT44(result.bigend.vect[2],result.bigend.vect[1]) * 8;
                          lVar53 = ((int)uVar9 * local_4e8 - (long)local_440) * lVar27 +
                                   (local_510 - local_444) * lVar44 + lVar54 + (long)local_448 * -8
                                   + result.smallend.vect._0_8_;
                          dVar56 = 0.0;
                          uVar36 = 0;
                          dVar55 = 0.0;
                          lVar21 = lVar49;
                          do {
                            if (0 < (int)uVar39) {
                              uVar34 = 0;
                              lVar42 = lVar53;
                              lVar48 = lVar21;
                              do {
                                if (0 < (int)uVar8) {
                                  uVar30 = 0;
                                  do {
                                    dVar57 = *(double *)(lVar42 + uVar30 * 8);
                                    dVar56 = dVar56 + dVar57;
                                    dVar55 = dVar55 + dVar57 * *(double *)(lVar48 + uVar30 * 8);
                                    uVar30 = uVar30 + 1;
                                  } while (uVar8 != uVar30);
                                }
                                uVar34 = uVar34 + 1;
                                lVar48 = lVar48 + lVar17 * 8;
                                lVar42 = lVar42 + lVar44;
                              } while (uVar34 != uVar39);
                            }
                            uVar36 = uVar36 + 1;
                            lVar21 = lVar21 + lVar41;
                            lVar53 = lVar53 + lVar27;
                          } while (uVar36 != uVar9);
                          dVar55 = dVar55 / dVar56;
                        }
                        pdVar11[lVar16 * local_4f0 +
                                (local_4e8 - iVar7) * lVar20 +
                                (local_4e0 - iVar6) * lVar15 + (lVar37 - iVar5)] = dVar55;
                        lVar37 = lVar37 + 1;
                        lVar49 = lVar49 + lVar43;
                        lVar54 = lVar54 + lVar43;
                      } while (local_484.bigend.vect[0] + 1 != (int)lVar37);
                    }
                    local_4e0 = local_4e0 + 1;
                    local_490 = local_490 + lVar17 * 8 * lVar26;
                    local_510 = local_510 + lVar26;
                  } while (local_484.bigend.vect[1] + 1 != (int)local_4e0);
                }
                local_4e8 = local_4e8 + 1;
              } while (local_484.bigend.vect[2] + 1 != (int)local_4e8);
            }
            local_4f0 = local_4f0 + 1;
            local_500 = local_500 + lVar25 * lVar41;
          } while (local_4f0 != (uint)ncomp);
        }
      }
      else if (FVar13 == singlevalued) {
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_258,&vfrac_fine->super_FabArray<amrex::FArrayBox>,&mfi);
        lVar33 = (long)local_484.smallend.vect[2];
        if (local_484.smallend.vect[2] <= local_484.bigend.vect[2]) {
          lVar26 = lVar18 * lVar17;
          iVar51 = iVar4 * local_484.smallend.vect[2];
          iVar29 = (local_484.smallend.vect[2] + 1) * iVar4;
          do {
            lVar43 = (long)iVar51;
            if (local_484.smallend.vect[1] <= local_484.bigend.vect[1]) {
              lVar37 = lVar33 * iVar4;
              lVar52 = (long)local_484.smallend.vect[1];
              iVar40 = (local_484.smallend.vect[1] + 1) * iVar3;
              iVar24 = iVar3 * local_484.smallend.vect[1];
              do {
                lVar49 = (long)iVar24;
                if (local_484.smallend.vect[0] <= local_484.bigend.vect[0]) {
                  lVar21 = lVar52 * iVar3;
                  lVar54 = (long)local_484.smallend.vect[0];
                  iVar23 = local_484.smallend.vect[0] * iVar2;
                  do {
                    if (0 < ncomp) {
                      lVar27 = (long)pdVar12 +
                               (long)iVar23 * 8 +
                               ((lVar1 * lVar25 + lVar32 * -8 + lVar43 * 8) * lVar18 + lVar31 * -8 +
                               lVar49 * 8) * lVar17 + lVar41 * -8;
                      lVar53 = (long)iVar23 * 8;
                      lVar44 = lVar54 * iVar2;
                      uVar36 = 0;
                      do {
                        if (lVar37 < (lVar33 + 1) * (long)iVar4) {
                          lVar50 = CONCAT44(result.bigend.vect[2],result.bigend.vect[1]) * 8;
                          lVar46 = CONCAT44(result.bigend.vect[0],result.smallend.vect[2]) * 8;
                          lVar45 = (lVar49 - local_444) * lVar46 + (lVar43 - local_440) * lVar50 +
                                   (long)local_448 * -8 + result.smallend.vect._0_8_ + lVar53;
                          lVar47 = (long)local_258.p +
                                   (lVar49 - local_258.begin.y) * local_258.jstride * 8 +
                                   (lVar43 - local_258.begin.z) * local_258.kstride * 8 +
                                   (long)local_258.begin.x * -8 + lVar53;
                          dVar56 = 0.0;
                          dVar55 = 0.0;
                          lVar42 = lVar27;
                          lVar48 = lVar43;
                          do {
                            lVar19 = lVar42;
                            lVar22 = lVar49;
                            lVar28 = lVar47;
                            lVar38 = lVar45;
                            if (lVar21 < (lVar52 + 1) * (long)iVar3) {
                              do {
                                if (lVar44 < (lVar54 + 1) * (long)iVar2) {
                                  lVar35 = 0;
                                  do {
                                    dVar57 = *(double *)(lVar38 + lVar35 * 8) *
                                             *(double *)(lVar28 + lVar35 * 8);
                                    dVar55 = dVar55 + *(double *)(lVar19 + lVar35 * 8) * dVar57;
                                    dVar56 = dVar56 + dVar57;
                                    lVar35 = lVar35 + 1;
                                  } while (iVar2 != (int)lVar35);
                                }
                                lVar22 = lVar22 + 1;
                                lVar38 = lVar38 + lVar46;
                                lVar28 = lVar28 + local_258.jstride * 8;
                                lVar19 = lVar19 + lVar17 * 8;
                              } while (iVar40 != (int)lVar22);
                            }
                            lVar48 = lVar48 + 1;
                            lVar45 = lVar45 + lVar50;
                            lVar47 = lVar47 + local_258.kstride * 8;
                            lVar42 = lVar42 + lVar26 * 8;
                          } while (iVar29 != (int)lVar48);
                          if (dVar56 <= 1e-30) goto LAB_004dd0a4;
                          dVar55 = dVar55 / dVar56;
                        }
                        else {
LAB_004dd0a4:
                          dVar55 = pdVar12[(lVar37 - lVar32) * lVar26 +
                                           (lVar21 - lVar31) * lVar17 +
                                           (lVar44 - lVar41) +
                                           ((long)scomp + uVar36) * lVar26 * lVar25];
                        }
                        pdVar11[(lVar33 - iVar7) * lVar20 +
                                (lVar52 - iVar6) * lVar15 + (lVar54 - iVar5) + lVar16 * uVar36] =
                             dVar55;
                        uVar36 = uVar36 + 1;
                        lVar27 = lVar27 + lVar25 * lVar26 * 8;
                      } while (uVar36 != (uint)ncomp);
                    }
                    lVar54 = lVar54 + 1;
                    iVar23 = iVar23 + iVar2;
                  } while (local_484.bigend.vect[0] + 1 != (int)lVar54);
                }
                lVar52 = lVar52 + 1;
                iVar24 = iVar24 + iVar3;
                iVar40 = iVar40 + iVar3;
              } while (local_484.bigend.vect[1] + 1 != (int)lVar52);
            }
            lVar33 = lVar33 + 1;
            iVar51 = iVar51 + iVar4;
            iVar29 = iVar29 + iVar4;
          } while (local_484.bigend.vect[2] + 1 != (int)lVar33);
        }
      }
      else {
        Abort_host("multi-valued avgdown to be implemented");
      }
      MFIter::operator++(&mfi);
    } while (mfi.currentIndex < mfi.endIndex);
  }
  MFIter::~MFIter(&mfi);
  period = Periodicity::NonPeriodic();
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
       (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>)
       (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x0;
  mfi.fabArray = (FabArrayBase *)((ulong)mfi.fabArray & 0xffffffff00000000);
  result.smallend.vect[0] = 0;
  result.smallend.vect[1] = 0;
  result.smallend.vect[2] = 0;
  FabArray<amrex::FArrayBox>::ParallelCopy_nowait
            (&S_crse->super_FabArray<amrex::FArrayBox>,&crse_S_fine.super_FabArray<amrex::FArrayBox>
             ,0,scomp,ncomp,(IntVect *)&mfi,&result.smallend,period,COPY,(CPC *)0x0,false);
  MultiFab::~MultiFab(&crse_S_fine);
  BoxArray::~BoxArray(&crse_S_fine_BA);
  return;
}

Assistant:

void
EB_average_down (const MultiFab& S_fine, MultiFab& S_crse, const MultiFab& vol_fine,
                 const MultiFab& vfrac_fine, int scomp, int ncomp, const IntVect& ratio)
{
    BL_PROFILE("EB_average_down");

    AMREX_ASSERT(S_fine.ixType().cellCentered());
    AMREX_ASSERT(S_crse.ixType().cellCentered());

    const DistributionMapping& fine_dm = S_fine.DistributionMap();
    BoxArray crse_S_fine_BA = S_fine.boxArray();
    crse_S_fine_BA.coarsen(ratio);

    MultiFab crse_S_fine(crse_S_fine_BA,fine_dm,ncomp,0,MFInfo(),FArrayBoxFactory());

    Dim3 dratio = ratio.dim3();

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(crse_S_fine,TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        const Box& tbx = mfi.tilebox();
        auto& crse_fab = crse_S_fine[mfi];
        const auto& fine_fab = S_fine[mfi];

        const auto& flag_fab = amrex::getEBCellFlagFab(fine_fab);
        FabType typ = flag_fab.getType(amrex::refine(tbx,ratio));

        Array4<Real> const& crse_arr = crse_fab.array();
        Array4<Real const> const& fine_arr = fine_fab.const_array();
        Array4<Real const> const& vol = vol_fine.const_array(mfi);

        if (typ == FabType::regular || typ == FabType::covered)
        {
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D(tbx, ncomp, i, j, k, n,
            {
                amrex_avgdown_with_vol(i,j,k,n, crse_arr, fine_arr, vol, 0, scomp, ratio);
            });
        }
        else if (typ == FabType::singlevalued)
        {
            Array4<Real const> const& vfrac = vfrac_fine.const_array(mfi);
            AMREX_HOST_DEVICE_FOR_3D(tbx, i, j, k,
            {
                eb_avgdown_with_vol(i,j,k,fine_arr,scomp,crse_arr,0,vol,vfrac,dratio,ncomp);
            });
        }
        else
        {
            amrex::Abort("multi-valued avgdown to be implemented");
        }
    }

    S_crse.ParallelCopy(crse_S_fine,0,scomp,ncomp);
}